

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O3

void runtest_maybe_dobin<std::pair<std::array<int,3ul>&,boost::array<int,3ul>&>,true>
               (string *header,pair<std::array<int,_3UL>_&,_boost::array<int,_3UL>_&> *arg)

{
  pointer pcVar1;
  long *plVar2;
  ostream *poVar3;
  long *plVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream log_fh;
  long *local_2a8;
  long local_298;
  long lStack_290;
  long *local_288 [2];
  long local_278 [2];
  long *local_268;
  long local_260;
  long local_258;
  long lStack_250;
  string local_248;
  undefined1 local_228 [248];
  ios_base local_130 [264];
  
  local_288[0] = local_278;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_288,basedir_abi_cxx11_._M_dataplus._M_p,
             basedir_abi_cxx11_._M_dataplus._M_p + basedir_abi_cxx11_._M_string_length);
  std::__cxx11::string::append((char *)local_288);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_288,(ulong)(header->_M_dataplus)._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_258 = *plVar4;
    lStack_250 = plVar2[3];
    local_268 = &local_258;
  }
  else {
    local_258 = *plVar4;
    local_268 = (long *)*plVar2;
  }
  local_260 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_268);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_298 = *plVar4;
    lStack_290 = plVar2[3];
    local_2a8 = &local_298;
  }
  else {
    local_298 = *plVar4;
    local_2a8 = (long *)*plVar2;
  }
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::ofstream::ofstream(local_228,(char *)local_2a8,_S_out);
  if (local_2a8 != &local_298) {
    operator_delete(local_2a8,local_298 + 1);
  }
  if (local_268 != &local_258) {
    operator_delete(local_268,local_258 + 1);
  }
  if (local_288[0] != local_278) {
    operator_delete(local_288[0],local_278[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"--- ",4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_228,(header->_M_dataplus)._M_p,header->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3," -------------------------------------",0x26);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"depth=",6);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_228);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_228,"ModeAutoDecoder=",0x10);
  local_298 = CONCAT17(local_298._7_1_,0x443165646f4d);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_228,(char *)&local_298,6);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  pcVar1 = (header->_M_dataplus)._M_p;
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar1,pcVar1 + header->_M_string_length);
  runtest_inner<std::pair<std::array<int,3ul>&,boost::array<int,3ul>&>,true>
            ((ostream *)local_228,&local_248,arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_228._0_8_ = _VTT;
  *(undefined8 *)(local_228 + (long)_VTT[-3]) = _setbuf;
  std::filebuf::~filebuf((filebuf *)(local_228 + 8));
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void runtest_maybe_dobin(std::string header, const T &arg) {
    std::ofstream log_fh((basedir+"/"+header+"-log.txt").c_str());
    log_fh << "--- " << header << " -------------------------------------" << std::endl;
    log_fh << "depth=" << ArrayTraits<T>::depth << std::endl;
    log_fh << "ModeAutoDecoder=" << ModeAutoDecoder<T>::mode::class_name() << std::endl;
    runtest_inner<T, DoBinary>(log_fh, header, arg);
}